

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int g1,int g2)

{
  int iVar1;
  int local_1c;
  int xAdvance;
  int g2_local;
  int g1_local;
  stbtt_fontinfo *info_local;
  
  local_1c = 0;
  if (info->gpos != 0) {
    local_1c = stbtt__GetGlyphGPOSInfoAdvance(info,g1,g2);
  }
  if (info->kern != 0) {
    iVar1 = stbtt__GetGlyphKernInfoAdvance(info,g1,g2);
    local_1c = iVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int g1, int g2)
{
   int xAdvance = 0;

   if (info->gpos)
      xAdvance += stbtt__GetGlyphGPOSInfoAdvance(info, g1, g2);

   if (info->kern)
      xAdvance += stbtt__GetGlyphKernInfoAdvance(info, g1, g2);

   return xAdvance;
}